

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_post_demo.c
# Opt level: O3

int callback_post_demo(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  uchar *buf;
  uchar *end;
  byte bVar1;
  int iVar2;
  int iVar3;
  uchar *in_RAX;
  lws_spa *spa;
  uchar *p;
  uchar *local_38;
  
  if ((int)reason < 0x10) {
    if (reason == LWS_CALLBACK_HTTP_BODY) {
      spa = *user;
      if (spa == (lws_spa *)0x0) {
        spa = lws_spa_create(wsi,param_names,4,0x400,file_upload_cb,user);
        *(lws_spa **)user = spa;
        if (spa == (lws_spa *)0x0) {
          return -1;
        }
        *(undefined1 *)((long)user + 0x818) = 0;
        *(undefined8 *)((long)user + 0x858) = 0;
      }
      iVar2 = lws_spa_process(spa,(char *)in,(int)len);
      if (iVar2 == 0) {
        return 0;
      }
      return -1;
    }
    if (reason != LWS_CALLBACK_HTTP_BODY_COMPLETION) {
      return 0;
    }
    local_38 = in_RAX;
    _lws_log(0x10,"LWS_CALLBACK_HTTP_BODY_COMPLETION: %p\n",wsi);
    lws_spa_finalize(*user);
    *(byte *)((long)user + 0x864) = *(byte *)((long)user + 0x864) | 1;
  }
  else {
    if (reason != LWS_CALLBACK_HTTP_WRITEABLE) {
      if (reason != LWS_CALLBACK_HTTP_DROP_PROTOCOL) {
        return 0;
      }
      if (*user == (lws_spa *)0x0) {
        return 0;
      }
      lws_spa_destroy(*user);
      *(undefined8 *)user = 0;
      return 0;
    }
    bVar1 = *(byte *)((long)user + 0x864);
    if ((bVar1 & 1) == 0) {
      return 0;
    }
    buf = (uchar *)((long)user + 0x18);
    local_38 = buf;
    if ((bVar1 & 2) != 0) {
      if ((bVar1 & 4) != 0) {
        return 0;
      }
      iVar2 = format_result((per_session_data__post_demo *)user);
      iVar2 = lws_write(wsi,buf,(long)iVar2,LWS_WRITE_HTTP_FINAL);
      *(byte *)((long)user + 0x864) = *(byte *)((long)user + 0x864) | 4;
      if (iVar2 < 0) {
        return 1;
      }
      iVar2 = lws_http_transaction_completed(wsi);
      return -(uint)(iVar2 != 0);
    }
    end = (uchar *)((long)user + 0x817);
    iVar2 = format_result((per_session_data__post_demo *)user);
    iVar3 = lws_add_http_header_status(wsi,200,&local_38,end);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = lws_add_http_header_by_token
                      (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,(uchar *)"text/html",9,&local_38,end);
    if (iVar3 != 0) {
      return 1;
    }
    iVar2 = lws_add_http_header_content_length(wsi,(long)iVar2,&local_38,end);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = lws_finalize_http_header(wsi,&local_38,end);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = lws_write(wsi,buf,(long)((int)local_38 - (int)buf),LWS_WRITE_HTTP_HEADERS);
    if (iVar2 < 0) {
      return 1;
    }
    *(byte *)((long)user + 0x864) = *(byte *)((long)user + 0x864) | 2;
  }
  lws_callback_on_writable(wsi);
  return 0;
}

Assistant:

static int
callback_post_demo(struct lws *wsi, enum lws_callback_reasons reason,
		   void *user, void *in, size_t len)
{
	struct per_session_data__post_demo *pss =
			(struct per_session_data__post_demo *)user;
	unsigned char *p, *start, *end;
	int n;

	switch (reason) {
	case LWS_CALLBACK_HTTP_BODY:
		/* create the POST argument parser if not already existing */
		if (!pss->spa) {
			pss->spa = lws_spa_create(wsi, param_names,
					LWS_ARRAY_SIZE(param_names), 1024,
					file_upload_cb, pss);
			if (!pss->spa)
				return -1;

			pss->filename[0] = '\0';
			pss->file_length = 0;
		}

		/* let it parse the POST data */
		if (lws_spa_process(pss->spa, in, (int)len))
			return -1;
		break;

	case LWS_CALLBACK_HTTP_BODY_COMPLETION:
		lwsl_debug("LWS_CALLBACK_HTTP_BODY_COMPLETION: %p\n", wsi);
		/* call to inform no more payload data coming */
		lws_spa_finalize(pss->spa);

		pss->completed = 1;
		lws_callback_on_writable(wsi);
		break;

	case LWS_CALLBACK_HTTP_WRITEABLE:
		if (!pss->completed)
			break;

		p = (unsigned char *)pss->result + LWS_PRE;
		start = p;
		end = p + sizeof(pss->result) - LWS_PRE - 1;

		if (!pss->sent_headers) {
			n = format_result(pss);

			if (lws_add_http_header_status(wsi, HTTP_STATUS_OK,
						       &p, end))
				goto bail;

			if (lws_add_http_header_by_token(wsi,
					WSI_TOKEN_HTTP_CONTENT_TYPE,
					(unsigned char *)"text/html", 9,
					&p, end))
				goto bail;
			if (lws_add_http_header_content_length(wsi, n, &p, end))
				goto bail;
			if (lws_finalize_http_header(wsi, &p, end))
				goto bail;

			/* first send the headers ... */
			n = lws_write(wsi, start, lws_ptr_diff(p, start),
				      LWS_WRITE_HTTP_HEADERS);
			if (n < 0)
				goto bail;

			pss->sent_headers = 1;
			lws_callback_on_writable(wsi);
			break;
		}

		if (!pss->sent_body) {
			n = format_result(pss);

			n = lws_write(wsi, (unsigned char *)start, n,
				      LWS_WRITE_HTTP_FINAL);

			pss->sent_body = 1;
			if (n < 0)
				return 1;
			goto try_to_reuse;
		}
		break;

	case LWS_CALLBACK_HTTP_DROP_PROTOCOL:
		/* called when our wsi user_space is going to be destroyed */
		if (pss->spa) {
			lws_spa_destroy(pss->spa);
			pss->spa = NULL;
		}
		break;

	default:
		break;
	}

	return 0;

bail:

	return 1;

try_to_reuse:
	if (lws_http_transaction_completed(wsi))
		return -1;

	return 0;
}